

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_grid.c
# Opt level: O1

REF_STATUS ref_grid_contiguous_cell_global(REF_GRID ref_grid,REF_LONG *global)

{
  int iVar1;
  int iVar2;
  REF_CELL ref_cell;
  uint uVar3;
  int *piVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  REF_LONG *cell_global;
  REF_LONG global_ncell;
  REF_LONG *local_50;
  REF_NODE local_48;
  REF_GRID local_40;
  long local_38;
  
  local_48 = ref_grid->node;
  lVar7 = 0;
  iVar6 = 0;
  lVar8 = 0;
  local_40 = ref_grid;
  while( true ) {
    ref_cell = local_40->cell[lVar7];
    uVar3 = ref_cell_global(ref_cell,local_48,&local_50);
    if (uVar3 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",0x4ff,
             "ref_grid_contiguous_cell_global",(ulong)uVar3,"cell global");
      return uVar3;
    }
    iVar1 = ref_cell->max;
    if (0 < (long)iVar1) {
      piVar4 = ref_cell->c2n;
      iVar2 = ref_cell->size_per;
      lVar5 = 0;
      do {
        if (*piVar4 != -1) {
          if (ref_cell->n <= lVar5) {
            if (local_50 != (REF_LONG *)0x0) {
              free(local_50);
            }
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",
                   0x503,"ref_grid_contiguous_cell_global",1,"pack grid before calling");
            return 1;
          }
          global[iVar6] = local_50[lVar5] + lVar8;
          iVar6 = iVar6 + 1;
        }
        lVar5 = lVar5 + 1;
        piVar4 = piVar4 + iVar2;
      } while (iVar1 != lVar5);
    }
    if (local_50 != (REF_LONG *)0x0) {
      free(local_50);
    }
    uVar3 = ref_cell_ncell(ref_cell,local_48,&local_38);
    if (uVar3 != 0) break;
    lVar8 = lVar8 + local_38;
    lVar7 = lVar7 + 1;
    if (lVar7 == 0x10) {
      return 0;
    }
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",0x509,
         "ref_grid_contiguous_cell_global",(ulong)uVar3,"global ncell");
  return uVar3;
}

Assistant:

REF_FCN REF_STATUS ref_grid_contiguous_cell_global(REF_GRID ref_grid,
                                                   REF_LONG *global) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT group, ncell, cell;
  REF_CELL ref_cell;
  REF_LONG *cell_global, global_ncell, offset;
  ncell = 0;
  offset = 0;
  each_ref_grid_all_ref_cell(ref_grid, group, ref_cell) {
    RSS(ref_cell_global(ref_cell, ref_node, &cell_global), "cell global");
    each_ref_cell_valid_cell(ref_cell, cell) {
      if (cell >= ref_cell_n(ref_cell)) {
        ref_free(cell_global);
        RSS(REF_FAILURE, "pack grid before calling");
      }
      global[ncell] = cell_global[cell] + offset;
      ncell++;
    }
    ref_free(cell_global);
    RSS(ref_cell_ncell(ref_cell, ref_node, &global_ncell), "global ncell");
    offset += global_ncell;
  }
  return REF_SUCCESS;
}